

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_math.h
# Opt level: O2

void grasshopper_copy128(grasshopper_w128_t *to,grasshopper_w128_t *from)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    to->q[lVar1] = from->q[lVar1];
  }
  return;
}

Assistant:

static GRASSHOPPER_INLINE void grasshopper_copy128(grasshopper_w128_t* to, const grasshopper_w128_t* from) {
#if(GRASSHOPPER_BITS == 8 || GRASSHOPPER_BITS == 16)
    __builtin_memcpy(&to, &from, sizeof(grasshopper_w128_t));
#else
		int i;
    for (i = 0; i < GRASSHOPPER_BIT_PARTS; i++) {
        GRASSHOPPER_ACCESS_128_VALUE(*to, i) = GRASSHOPPER_ACCESS_128_VALUE(*from, i);
    }
#endif
}